

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

TString * LoadString(LoadState *S)

{
  size_t in_RAX;
  char *str;
  TString *pTVar1;
  size_t size;
  size_t local_18;
  
  local_18 = in_RAX;
  LoadBlock(S,&local_18,8);
  if (local_18 == 0) {
    pTVar1 = (TString *)0x0;
  }
  else {
    str = luaZ_openspace(S->L,S->b,local_18);
    LoadBlock(S,str,local_18);
    pTVar1 = luaS_newlstr(S->L,str,local_18 - 1);
  }
  return pTVar1;
}

Assistant:

static TString* LoadString(LoadState* S)
{
 size_t size;
 LoadVar(S,size);
 if (size==0)
  return NULL;
 else
 {
  char* s=luaZ_openspace(S->L,S->b,size);
  LoadBlock(S,s,size);
  return luaS_newlstr(S->L,s,size-1);		/* remove trailing '\0' */
 }
}